

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sharpyuv_csp.c
# Opt level: O2

SharpYuvConversionMatrix * SharpYuvGetConversionMatrix(SharpYuvMatrixType matrix_type)

{
  if (matrix_type < (kSharpYuvMatrixRec709Full|kSharpYuvMatrixRec601Full)) {
    return (SharpYuvConversionMatrix *)(&PTR_kWebpMatrix_0019ad68)[matrix_type];
  }
  return (SharpYuvConversionMatrix *)0x0;
}

Assistant:

const SharpYuvConversionMatrix* SharpYuvGetConversionMatrix(
    SharpYuvMatrixType matrix_type) {
  switch (matrix_type) {
    case kSharpYuvMatrixWebp:
      return &kWebpMatrix;
    case kSharpYuvMatrixRec601Limited:
      return &kRec601LimitedMatrix;
    case kSharpYuvMatrixRec601Full:
      return &kRec601FullMatrix;
    case kSharpYuvMatrixRec709Limited:
      return &kRec709LimitedMatrix;
    case kSharpYuvMatrixRec709Full:
      return &kRec709FullMatrix;
    case kSharpYuvMatrixNum:
      return NULL;
  }
  return NULL;
}